

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O2

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
Gudhi::Persistence_representations::Persistence_intervals::dominant_intervals
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,Persistence_intervals *this,size_t where_to_cut)

{
  double dVar1;
  double dVar2;
  pointer ppVar3;
  pointer ppVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  size_t i_1;
  allocator_type local_41;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  position_length_vector;
  
  std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ::vector(&position_length_vector,
           (long)(this->intervals).
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->intervals).
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4,&local_41);
  ppVar3 = (this->intervals).
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (this->intervals).
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = 8;
  for (lVar7 = 0; (long)ppVar4 - (long)ppVar3 >> 4 != lVar7; lVar7 = lVar7 + 1) {
    dVar1 = *(double *)((long)&ppVar3->first + lVar6);
    dVar2 = *(double *)((long)ppVar3 + lVar6 + -8);
    *(long *)((long)position_length_vector.
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar6 + -8) = lVar7;
    *(double *)
     ((long)&(position_length_vector.
              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->first + lVar6) = dVar1 - dVar2;
    lVar6 = lVar6 + 0x10;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<unsigned_long,double>const&,std::pair<unsigned_long,double>const&)>>
            ((__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
              )position_length_vector.
               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
              )position_length_vector.
               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_std::pair<unsigned_long,_double>_&,_const_std::pair<unsigned_long,_double>_&)>
              )0x10275b);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar8 = (long)position_length_vector.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)position_length_vector.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (where_to_cut <= uVar8) {
    uVar8 = where_to_cut;
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::reserve
            (__return_storage_ptr__,uVar8);
  lVar6 = 0;
  uVar8 = 0;
  while( true ) {
    uVar5 = (long)position_length_vector.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)position_length_vector.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    if (where_to_cut <= uVar5) {
      uVar5 = where_to_cut;
    }
    if (uVar8 == uVar5) break;
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
              (__return_storage_ptr__,
               (this->intervals).
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               *(long *)((long)&(position_length_vector.
                                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first + lVar6));
    uVar8 = uVar8 + 1;
    lVar6 = lVar6 + 0x10;
  }
  std::
  _Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ::~_Vector_base(&position_length_vector.
                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, double> > Persistence_intervals::dominant_intervals(size_t where_to_cut) const {
  bool dbg = false;
  std::vector<std::pair<size_t, double> > position_length_vector(this->intervals.size());
  for (size_t i = 0; i != this->intervals.size(); ++i) {
    position_length_vector[i] = std::make_pair(i, this->intervals[i].second - this->intervals[i].first);
  }

  std::sort(position_length_vector.begin(), position_length_vector.end(), compare);

  std::vector<std::pair<double, double> > result;
  result.reserve(std::min(where_to_cut, position_length_vector.size()));

  for (size_t i = 0; i != std::min(where_to_cut, position_length_vector.size()); ++i) {
    result.push_back(this->intervals[position_length_vector[i].first]);
    if (dbg)
      std::clog << "Position : " << position_length_vector[i].first << " length : " << position_length_vector[i].second
                << std::endl;
  }

  return result;
}